

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__jpeg_get_bit(stbi__jpeg *j)

{
  uint uVar1;
  long in_RDI;
  uint k;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (*(int *)(in_RDI + 0x4824) < 1) {
    stbi__grow_buffer_unsafe
              ((stbi__jpeg *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  uVar1 = *(uint *)(in_RDI + 0x4820);
  *(int *)(in_RDI + 0x4820) = *(int *)(in_RDI + 0x4820) << 1;
  *(int *)(in_RDI + 0x4824) = *(int *)(in_RDI + 0x4824) + -1;
  return uVar1 & 0x80000000;
}

Assistant:

stbi_inline static int stbi__jpeg_get_bit(stbi__jpeg *j)
{
   unsigned int k;
   if (j->code_bits < 1) stbi__grow_buffer_unsafe(j);
   k = j->code_buffer;
   j->code_buffer <<= 1;
   --j->code_bits;
   return k & 0x80000000;
}